

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom-formatter-test.cc
# Opt level: O2

string * custom_vformat_abi_cxx11_
                   (string *__return_storage_ptr__,string_view format_str,format_args args)

{
  memory_buffer buffer;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_220;
  
  local_220.super_basic_buffer<char>.ptr_ = local_220.store_;
  local_220.super_basic_buffer<char>.size_ = 0;
  local_220.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00153018;
  local_220.super_basic_buffer<char>.capacity_ = 500;
  fmt::v5::
  vformat_to<custom_arg_formatter,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_220,format_str,
             args.
             super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             ,(locale_ref)0x0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_220.super_basic_buffer<char>.ptr_,
             local_220.super_basic_buffer<char>.ptr_ + local_220.super_basic_buffer<char>.size_);
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&local_220)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string custom_vformat(fmt::string_view format_str, fmt::format_args args) {
  fmt::memory_buffer buffer;
  // Pass custom argument formatter as a template arg to vwrite.
  fmt::vformat_to<custom_arg_formatter>(buffer, format_str, args);
  return std::string(buffer.data(), buffer.size());
}